

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O1

TestObject * __thiscall StressTester::CreateRandom(StressTester *this)

{
  Recycler *recycler;
  TestObject *val;
  long lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  TestObject *pTVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  undefined8 *puVar9;
  ulong auStack_50 [3];
  ulong local_38;
  
  auStack_50[0] = 0x75c5a1;
  iVar2 = PAL_rand();
  auStack_50[1] = CONCAT44(extraout_var,iVar2);
  auStack_50[2] = (ulong)(uint)((iVar2 / 5000) * 5000);
  uVar7 = iVar2 % 5000;
  local_38 = (ulong)uVar7;
  uVar6 = (long)(int)uVar7 * 8 + 0x37U & 0xfffffffffffffff0;
  lVar1 = -uVar6;
  puVar9 = (undefined8 *)((ulong)(&stack0xffffffffffffffd7 + -uVar6) & 0xffffffffffffffe0);
  if (-1 < (int)uVar7) {
    uVar6 = 0;
    do {
      recycler = this->recycler;
      *(undefined8 *)((long)auStack_50 + lVar1) = 0x75c60c;
      iVar2 = PAL_rand();
      *(undefined8 *)((long)auStack_50 + lVar1) = 0x75c61e;
      pTVar4 = TestObject::Create(recycler,10,(long)iVar2,NormalObj);
      puVar9[uVar6] = pTVar4;
      uVar6 = uVar6 + 1;
    } while (uVar7 + 1 != uVar6);
  }
  if (-1 < (int)local_38) {
    iVar5 = (int)auStack_50[2];
    iVar2 = (int)auStack_50[1];
    local_38 = (ulong)((int)local_38 + 1);
    uVar6 = 0;
    do {
      iVar8 = 5;
      do {
        pTVar4 = (TestObject *)puVar9[uVar6];
        *(undefined8 *)((long)auStack_50 + lVar1) = 0x75c65f;
        iVar3 = PAL_rand();
        val = (TestObject *)puVar9[iVar3 % ((iVar2 - iVar5) + 1)];
        *(undefined8 *)((long)auStack_50 + lVar1) = 0x75c673;
        TestObject::SetRandom(pTVar4,val);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_38);
  }
  return (TestObject *)*puVar9;
}

Assistant:

TestObject *StressTester::CreateRandom()
{
    int numObjects = rand() % 5000 + 1;

    void *memory = _alloca(numObjects * sizeof(TestObject*)+OBJALIGN);
    TestObject **objs = reinterpret_cast<TestObject**>(AlignPtr(memory, OBJALIGN));

    // Create the objects
    for (int i = 0; i < numObjects; ++i)
    {
        objs[i] = TestObject::Create(recycler, 10, rand());
    }

    // Create links between objects
    for (int i = 0; i < numObjects; ++i)
    {
        for (int j = 0; j < 5; ++j)
        {
            objs[i]->SetRandom(objs[rand() % numObjects]);
        }
    }

    return objs[0];
}